

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

string * __thiscall
helics::helicsComplexVectorString_abi_cxx11_
          (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val)

{
  char *in_RSI;
  string *in_RDI;
  undefined1 in_stack_00000180 [16];
  undefined1 in_stack_00000190 [16];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffff40;
  string_view in_stack_ffffffffffffff48;
  value<fmt::v11::context> local_78;
  undefined8 local_60;
  value<fmt::v11::context> *local_58;
  char *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  char *local_38;
  undefined8 local_30;
  value<fmt::v11::context> *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  value<fmt::v11::context> *local_8;
  
  ::fmt::v11::basic_string_view<char>::basic_string_view((basic_string_view<char> *)in_RDI,in_RSI);
  ::fmt::v11::
  join<const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_0>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  local_38 = "[{}]";
  local_30 = 4;
  local_40 = &stack0xffffffffffffff48;
  local_50 = "[{}]";
  local_48 = 4;
  local_8 = &local_78;
  local_10 = local_40;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<fmt::v11::join_view<__gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,___gnu_cxx::__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_char>,_0>
            (local_8,local_40);
  local_18 = &local_60;
  local_20 = &local_78;
  local_60 = 0xf;
  local_58 = local_20;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000190,(format_args)in_stack_00000180);
  return in_RDI;
}

Assistant:

std::string helicsComplexVectorString(const std::vector<std::complex<double>>& val)
{
    return fmt::format("[{}]", fmt::join(val, ","));
}